

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFrames(Abc_Ntk_t *pNtk,int nFrames,int fInitial,int fVerbose)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p;
  ProgressBar *p_00;
  uint local_440;
  int local_43c;
  int Counter;
  int i;
  Abc_Obj_t *pLatchOut;
  Abc_Obj_t *pLatch;
  Abc_Ntk_t *pNtkFrames;
  ProgressBar *pProgress;
  char Buffer [1000];
  int fVerbose_local;
  int fInitial_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x30b,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x30c,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x30d,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x30e,"Abc_Ntk_t *Abc_NtkFrames(Abc_Ntk_t *, int, int, int)");
  }
  pNtk_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf((char *)&pProgress,"%s_%d_frames",pNtk->pName,(ulong)(uint)nFrames);
  pcVar2 = Extra_UtilStrsav((char *)&pProgress);
  pNtk_local->pName = pcVar2;
  pAVar3 = Abc_AigConst1(pNtk_local);
  pAVar4 = Abc_AigConst1(pNtk);
  (pAVar4->field_6).pCopy = pAVar3;
  if (fInitial == 0) {
    for (local_43c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_43c < iVar1;
        local_43c = local_43c + 1) {
      pAVar3 = Abc_NtkBox(pNtk,local_43c);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 != 0) {
        Abc_NtkDupBox(pNtk_local,pAVar3,1);
      }
    }
  }
  else {
    local_440 = 0;
    for (local_43c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_43c < iVar1;
        local_43c = local_43c + 1) {
      pAVar3 = Abc_NtkBox(pNtk,local_43c);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 != 0) {
        pAVar4 = Abc_ObjFanout0(pAVar3);
        iVar1 = Abc_LatchIsInitNone(pAVar3);
        if ((iVar1 == 0) && (iVar1 = Abc_LatchIsInitDc(pAVar3), iVar1 == 0)) {
          p = Abc_AigConst1(pNtk_local);
          iVar1 = Abc_LatchIsInit0(pAVar3);
          pAVar3 = Abc_ObjNotCond(p,iVar1);
          (pAVar4->field_6).pCopy = pAVar3;
        }
        else {
          pAVar3 = Abc_NtkCreatePi(pNtk_local);
          (pAVar4->field_6).pCopy = pAVar3;
          pAVar3 = (pAVar4->field_6).pCopy;
          pcVar2 = Abc_ObjName(pAVar4);
          Abc_ObjAssignName(pAVar3,pcVar2,(char *)0x0);
          local_440 = local_440 + 1;
        }
      }
    }
    if (local_440 != 0) {
      printf("Warning: %d uninitialized latches are replaced by free PI variables.\n",
             (ulong)local_440);
    }
  }
  p_00 = Extra_ProgressBarStart(_stdout,nFrames);
  for (local_43c = 0; local_43c < nFrames; local_43c = local_43c + 1) {
    Extra_ProgressBarUpdate(p_00,local_43c,(char *)0x0);
    Abc_NtkAddFrame(pNtk_local,pNtk,local_43c);
  }
  Extra_ProgressBarStop(p_00);
  if (fInitial == 0) {
    for (local_43c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_43c < iVar1;
        local_43c = local_43c + 1) {
      pAVar3 = Abc_NtkBox(pNtk,local_43c);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 != 0) {
        pAVar4 = Abc_ObjFanin0(pAVar3);
        pAVar4 = (pAVar4->field_6).pCopy;
        pAVar3 = Abc_ObjFanout0(pAVar3);
        Abc_ObjAddFanin(pAVar4,(pAVar3->field_6).pCopy);
      }
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_local->pManFunc);
  Abc_NtkOrderCisCos(pNtk_local);
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkFrames: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkFrames( Abc_Ntk_t * pNtk, int nFrames, int fInitial, int fVerbose )
{
    char Buffer[1000];
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkFrames;
    Abc_Obj_t * pLatch, * pLatchOut;
    int i, Counter;
    assert( nFrames > 0 );
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );
    // start the new network
    pNtkFrames = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%d_frames", pNtk->pName, nFrames );
    pNtkFrames->pName = Extra_UtilStrsav(Buffer);
    // map the constant nodes
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkFrames);
    // create new latches (or their initial values) and remember them in the new latches
    if ( !fInitial )
    {
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Abc_NtkDupBox( pNtkFrames, pLatch, 1 );
    }
    else
    {
        Counter = 0;
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            pLatchOut = Abc_ObjFanout0(pLatch);
            if ( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) ) // don't-care initial value - create a new PI
            {
                pLatchOut->pCopy = Abc_NtkCreatePi(pNtkFrames);
                Abc_ObjAssignName( pLatchOut->pCopy, Abc_ObjName(pLatchOut), NULL );
                Counter++;
            }
            else
                pLatchOut->pCopy = Abc_ObjNotCond( Abc_AigConst1(pNtkFrames), Abc_LatchIsInit0(pLatch) );
        }
        if ( Counter )
            printf( "Warning: %d uninitialized latches are replaced by free PI variables.\n", Counter );
    }
    
    // create the timeframes
    pProgress = Extra_ProgressBarStart( stdout, nFrames );
    for ( i = 0; i < nFrames; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Abc_NtkAddFrame( pNtkFrames, pNtk, i );
    }
    Extra_ProgressBarStop( pProgress );
    
    // connect the new latches to the outputs of the last frame
    if ( !fInitial )
    {
        // we cannot use pLatch->pCopy here because pLatch->pCopy is used for temporary storage of strashed values
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pLatch)->pCopy, Abc_ObjFanout0(pLatch)->pCopy );
    }

    // remove dangling nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkFrames->pManFunc );
    // reorder the latches
    Abc_NtkOrderCisCos( pNtkFrames );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkFrames ) )
    {
        printf( "Abc_NtkFrames: The network check has failed.\n" );
        Abc_NtkDelete( pNtkFrames );
        return NULL;
    }
    return pNtkFrames;
}